

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall
fmt::internal::PrintfArgFormatter<wchar_t>::visit_cstring
          (PrintfArgFormatter<wchar_t> *this,char *value)

{
  FormatSpec *pFVar1;
  size_t in_RCX;
  void *__buf;
  ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t> *in_RSI;
  ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t> *in_RDI;
  
  if (in_RSI == (ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t> *)0x0) {
    pFVar1 = ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>::spec(in_RDI);
    if (pFVar1->type_ == 'p') {
      write_null_pointer((PrintfArgFormatter<wchar_t> *)in_RSI);
    }
    else {
      ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>::write
                (in_RDI,0x57f65a,__buf,in_RCX);
    }
  }
  else {
    ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>::visit_cstring
              (in_RSI,(char *)in_RDI);
  }
  return;
}

Assistant:

void visit_cstring(const char *value) {
    if (value)
      Base::visit_cstring(value);
    else if (this->spec().type_ == 'p')
      write_null_pointer();
    else
      this->write("(null)");
  }